

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::active_group::impl::real_private_dispatcher_t::~real_private_dispatcher_t
          (real_private_dispatcher_t *this)

{
  real_private_dispatcher_t *this_local;
  
  ~real_private_dispatcher_t(this);
  operator_delete(this);
  return;
}

Assistant:

~real_private_dispatcher_t()
			{
				shutdown_and_wait( *m_disp );
			}